

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O1

Message * __thiscall hrgls::Message::operator=(Message *this,Message *copy)

{
  Message_private *pMVar1;
  hrgls_Status hVar2;
  Message_private *pMVar3;
  hrgls_Message phVar4;
  
  if (this->m_private != (Message_private *)0x0) {
    if (this->m_private->Message != (hrgls_Message)0x0) {
      hrgls_MessageDestroy();
    }
    if (this->m_private != (Message_private *)0x0) {
      operator_delete(this->m_private);
    }
  }
  pMVar3 = (Message_private *)operator_new(0x10);
  pMVar3->Message = (hrgls_Message)0x0;
  *(undefined8 *)&pMVar3->status = 0;
  this->m_private = pMVar3;
  pMVar1 = copy->m_private;
  phVar4 = (hrgls_Message)0x0;
  if (pMVar1 != (Message_private *)0x0) {
    phVar4 = pMVar1->Message;
    hVar2 = 0;
    if (phVar4 == (hrgls_Message)0x0) {
      hVar2 = 0x3ee;
    }
    pMVar1->status = hVar2;
  }
  hVar2 = hrgls_MessageCopy(pMVar3,phVar4);
  this->m_private->status = hVar2;
  return this;
}

Assistant:

Message &Message::operator = (const Message &copy)
  {
    if (m_private) {
      if (m_private->Message) {
        hrgls_MessageDestroy(m_private->Message);
      }
      delete m_private;
    }
    m_private = new Message_private();
    m_private->status = hrgls_MessageCopy(&m_private->Message, copy.RawMessage());
    return *this;
  }